

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zip_get_file_comment.c
# Opt level: O2

char * zip_get_file_comment(zip_t *za,zip_uint64_t idx,int *lenp,int flags)

{
  char *pcVar1;
  zip_uint32_t len;
  zip_uint32_t local_c;
  
  pcVar1 = zip_file_get_comment(za,idx,&local_c,flags);
  if (lenp != (int *)0x0 && pcVar1 != (char *)0x0) {
    *lenp = local_c;
  }
  return pcVar1;
}

Assistant:

ZIP_EXTERN const char *
zip_get_file_comment(zip_t *za, zip_uint64_t idx, int *lenp, int flags) {
    zip_uint32_t len;
    const char *s;

    if ((s = zip_file_get_comment(za, idx, &len, (zip_flags_t)flags)) != NULL) {
	if (lenp)
	    *lenp = (int)len;
    }

    return s;
}